

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode cf_he_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  uint uVar1;
  void *pvVar2;
  long *plVar3;
  curl_trc_feat *pcVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  CURLcode CVar10;
  ulong uVar11;
  _Bool bdone;
  char local_39;
  Curl_cfilter *local_38;
  
  if ((cf->field_0x24 & 1) == 0) {
    pvVar2 = cf->ctx;
    lVar7 = 0;
    bVar5 = true;
    local_38 = cf;
    do {
      bVar9 = bVar5;
      lVar7 = *(long *)((long)pvVar2 + lVar7 * 8 + 0x20);
      local_39 = '\0';
      if (((lVar7 != 0) && (plVar3 = *(long **)(lVar7 + 0x28), plVar3 != (long *)0x0)) &&
         ((*(byte *)(lVar7 + 100) & 0x10) == 0)) {
        iVar6 = (**(code **)(*plVar3 + 0x28))(plVar3,data,&local_39);
        *(int *)(lVar7 + 0x5c) = iVar6;
        if ((iVar6 != 0) || (local_39 == '\x01')) {
          *(byte *)(lVar7 + 100) = *(byte *)(lVar7 + 100) | 0x10;
        }
      }
      lVar7 = 1;
      bVar5 = false;
    } while (bVar9);
    *done = true;
    bVar5 = true;
    lVar7 = 0;
    bVar9 = true;
    do {
      bVar8 = bVar9;
      lVar7 = *(long *)((long)pvVar2 + lVar7 * 8 + 0x20);
      if ((lVar7 != 0) && ((*(byte *)(lVar7 + 100) & 0x10) == 0)) {
        *done = false;
        bVar5 = false;
      }
      lVar7 = 1;
      uVar11 = 0;
      bVar9 = false;
    } while (bVar8);
    if (bVar5) {
      uVar11 = 0;
      lVar7 = 0;
      bVar9 = true;
      do {
        bVar8 = bVar9;
        lVar7 = *(long *)((long)pvVar2 + lVar7 * 8 + 0x20);
        if ((lVar7 != 0) && (uVar1 = *(uint *)(lVar7 + 0x5c), uVar1 != 0)) {
          uVar11 = (ulong)uVar1;
        }
        lVar7 = 1;
        bVar9 = false;
      } while (bVar8);
    }
    CVar10 = (CURLcode)uVar11;
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
      pcVar4 = (data->state).feat;
      if (pcVar4 == (curl_trc_feat *)0x0) {
        if (local_38 == (Curl_cfilter *)0x0) {
          return CVar10;
        }
      }
      else {
        if (local_38 == (Curl_cfilter *)0x0) {
          return CVar10;
        }
        if (pcVar4->log_level < 1) {
          return CVar10;
        }
      }
      if (0 < local_38->cft->log_level) {
        Curl_trc_cf_infof(data,local_38,"shutdown -> %d, done=%d",uVar11,(ulong)bVar5);
      }
    }
  }
  else {
    *done = true;
    CVar10 = CURLE_OK;
  }
  return CVar10;
}

Assistant:

static CURLcode cf_he_shutdown(struct Curl_cfilter *cf,
                               struct Curl_easy *data, bool *done)
{
  struct cf_he_ctx *ctx = cf->ctx;
  size_t i;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* shutdown all ballers that have not done so already. If one fails,
   * continue shutting down others until all are shutdown. */
  for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
    struct eyeballer *baller = ctx->baller[i];
    bool bdone = FALSE;
    if(!baller || !baller->cf || baller->shutdown)
      continue;
    baller->result = baller->cf->cft->do_shutdown(baller->cf, data, &bdone);
    if(baller->result || bdone)
      baller->shutdown = TRUE; /* treat a failed shutdown as done */
  }

  *done = TRUE;
  for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
    if(ctx->baller[i] && !ctx->baller[i]->shutdown)
      *done = FALSE;
  }
  if(*done) {
    for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
      if(ctx->baller[i] && ctx->baller[i]->result)
        result = ctx->baller[i]->result;
    }
  }
  CURL_TRC_CF(data, cf, "shutdown -> %d, done=%d", result, *done);
  return result;
}